

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetBXTransform(ndicapi *pol,int portHandle,float *transform)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  float (*pafVar5) [8];
  
  pafVar5 = pol->BxTransforms;
  uVar4 = 0;
  while( true ) {
    if (pol->BxHandleCount == uVar4) {
      return 1;
    }
    if (pol->BxHandles[uVar4] == portHandle) break;
    uVar4 = uVar4 + 1;
    pafVar5 = pafVar5 + 1;
  }
  if (pol->BxHandleCount == uVar4) {
    return 1;
  }
  uVar1 = *(undefined8 *)*pafVar5;
  uVar2 = *(undefined8 *)(*pafVar5 + 2);
  uVar3 = *(undefined8 *)(*pafVar5 + 6);
  *(undefined8 *)(transform + 4) = *(undefined8 *)(*pafVar5 + 4);
  *(undefined8 *)(transform + 6) = uVar3;
  *(undefined8 *)transform = uVar1;
  *(undefined8 *)(transform + 2) = uVar2;
  if ((pol->BxHandlesStatus[uVar4] & 4U) != 0) {
    return 1;
  }
  return (byte)pol->BxHandlesStatus[uVar4] & 2;
}

Assistant:

ndicapiExport int ndiGetBXTransform(ndicapi* pol, int portHandle, float transform[8])
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(&transform[0], &pol->BxTransforms[i][0], sizeof(float) * 8);
  if (pol->BxHandlesStatus[i] & NDI_HANDLE_DISABLED)
  {
    return NDI_DISABLED;
  }
  else if (pol->BxHandlesStatus[i] & NDI_HANDLE_MISSING)
  {
    return NDI_MISSING;
  }

  return NDI_OKAY;
}